

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O1

from_chars_result __thiscall
semver::detail::parse<long,long,long>(detail *this,string_view str,version<long,_long,_long> *out)

{
  pointer ptVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  errc eVar5;
  from_chars_result fVar6;
  token_stream token_stream;
  undefined1 local_78 [8];
  pointer ptStack_70;
  iterator local_68;
  token *ptStack_60;
  token local_50;
  lexer local_40;
  
  pcVar3 = (char *)str._M_len;
  local_68._M_current = (token *)0x0;
  ptStack_60 = (token *)0x0;
  local_78 = (undefined1  [8])0x0;
  ptStack_70 = (pointer)0x0;
  local_40.current_pos_ = 0;
  local_40.text_._M_len = (size_t)this;
  local_40.text_._M_str = pcVar3;
  if (this == (detail *)0x0) {
    eVar5 = 0;
  }
  else {
    do {
      fVar6 = lexer::scan_token(&local_40,(token_stream *)local_78);
      pcVar3 = fVar6.super_from_chars_result.ptr;
      eVar5 = fVar6.super_from_chars_result.ec;
      if (eVar5 != 0) goto LAB_0016400e;
    } while (local_40.current_pos_ < local_40.text_._M_len);
  }
  local_50.type = eol;
  local_50.value.
  super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  _M_u = (_Variadic_union<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)0x0;
  local_50.value.
  super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  _M_index = '\0';
  local_50.lexeme = local_40.text_._M_str + (long)(undefined1 *)local_40.text_._M_len;
  if (local_68._M_current == ptStack_60) {
    std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
    _M_realloc_insert<semver::detail::token_const&>
              ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)&ptStack_70,
               local_68,&local_50);
  }
  else {
    lVar2 = (ulong)(uint5)local_50._3_5_ << 0x18;
    (local_68._M_current)->type = (char)lVar2;
    (local_68._M_current)->value = (value_t)(short)((ulong)lVar2 >> 8);
    *(int5 *)&(local_68._M_current)->field_0x3 = (int5)((ulong)lVar2 >> 0x18);
    (local_68._M_current)->lexeme = local_50.lexeme;
    local_68._M_current = local_68._M_current + 1;
  }
LAB_0016400e:
  if (eVar5 == 0) {
    local_40.text_._M_len = (size_t)local_78;
    fVar6 = version_parser::parse<long,long,long>
                      ((version_parser *)&local_40,(version<long,_long,_long> *)str._M_str);
    pcVar3 = fVar6.super_from_chars_result.ptr;
    eVar5 = fVar6.super_from_chars_result.ec;
    if (eVar5 == 0) {
      sVar4 = (long)local_78 + 1;
      ptVar1 = ptStack_70 + (long)local_78;
      pcVar3 = ptStack_70[(long)local_78].lexeme;
      eVar5 = invalid_argument;
      local_78 = (undefined1  [8])sVar4;
      if (ptVar1->type == eol) {
        eVar5 = 0;
      }
    }
  }
  if (ptStack_70 != (pointer)0x0) {
    operator_delete(ptStack_70,(long)ptStack_60 - (long)ptStack_70);
  }
  fVar6.super_from_chars_result.ec = eVar5;
  fVar6.super_from_chars_result.ptr = pcVar3;
  fVar6.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar6.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(std::string_view str, version<I1, I2, I3>& out) {
  token_stream token_stream;
  from_chars_result result = lexer{ str }.scan_tokens(token_stream);
  if (!result) {
    return result;
  }

  result = version_parser{ token_stream }.parse(out);
  if (!result) {
    return result;
  }

  if (!token_stream.consume(token_type::eol)) {
    return failure(token_stream.previous().lexeme);
  }

  return success(token_stream.previous().lexeme);
}